

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O2

void InitSystemAllocators(void)

{
  mmap_space.bytes_._0_8_ = &PTR__SysAllocator_00139698;
  mmap_space.bytes_[8] = '\0';
  mmap_space.bytes_[9] = '\0';
  mmap_space.bytes_[10] = '\0';
  mmap_space.bytes_[0xb] = '\0';
  mmap_space.bytes_[0xc] = '\0';
  mmap_space.bytes_[0xd] = '\0';
  mmap_space.bytes_[0xe] = '\0';
  mmap_space.bytes_[0xf] = '\0';
  sbrk_space.bytes_ = (uint8_t  [8])&PTR__SysAllocator_00139658;
  DefaultSysAllocator::DefaultSysAllocator((DefaultSysAllocator *)&default_space);
  default_space.bytes_._16_8_ = &sbrk_space;
  default_space.bytes_[8] = '\0';
  default_space.bytes_[9] = '\0';
  default_space.bytes_._32_8_ = sbrk_name;
  default_space.bytes_._24_8_ = &mmap_space;
  default_space.bytes_._40_8_ = mmap_name;
  tcmalloc_sys_alloc = tc_get_sysalloc_override((SysAllocator *)&default_space);
  return;
}

Assistant:

void InitSystemAllocators(void) {
  MmapSysAllocator *mmap = mmap_space.Construct();
  SbrkSysAllocator *sbrk = sbrk_space.Construct();

  // In 64-bit debug mode, place the mmap allocator first since it
  // allocates pointers that do not fit in 32 bits and therefore gives
  // us better testing of code's 64-bit correctness.  It also leads to
  // less false negatives in heap-checking code.  (Numbers are less
  // likely to look like pointers and therefore the conservative gc in
  // the heap-checker is less likely to misinterpret a number as a
  // pointer).
  DefaultSysAllocator *sdef = default_space.Construct();
  bool want_mmap = kDebugMode && (sizeof(void*) > 4);
  if (want_mmap) {
    sdef->SetChildAllocator(mmap, 0, mmap_name);
    sdef->SetChildAllocator(sbrk, 1, sbrk_name);
  } else {
    sdef->SetChildAllocator(sbrk, 0, sbrk_name);
    sdef->SetChildAllocator(mmap, 1, mmap_name);
  }

  tcmalloc_sys_alloc = tc_get_sysalloc_override(sdef);
}